

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O1

void __thiscall OpenMD::Electrostatic::addType(Electrostatic *this,AtomType *atomType)

{
  undefined8 *puVar1;
  int n;
  size_t sVar2;
  pointer pEVar3;
  RealType RVar4;
  undefined8 uVar5;
  size_t sVar6;
  int m;
  bool bVar7;
  long lVar8;
  _Base_ptr p_Var9;
  int iVar10;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar11;
  int atid;
  MultipoleAdapter ma;
  CubicSplinePtr J;
  vector<double,_std::allocator<double>_> Jvals;
  RealType rval;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  vector<double,_std::allocator<double>_> rvals;
  uint local_18c;
  MultipoleAdapter local_188;
  CubicSpline *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  double local_170;
  vector<double,_std::allocator<double>_> local_168;
  long local_150;
  double local_148;
  _Rb_tree_node_base *local_140;
  long local_138;
  RealType local_130;
  RealType local_128;
  double local_120;
  FluctuatingChargeAdapter local_118;
  FixedChargeAdapter local_110;
  Mat3x3d local_108;
  value_type local_c0;
  
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
       0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
       0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
       0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
       0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
       0.0;
  local_c0.dipole.super_Vector<double,_3U>.data_[2] = 0.0;
  local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       0.0;
  local_c0.dipole.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c0.dipole.super_Vector<double,_3U>.data_[1] = 0.0;
  local_c0.is_Charge = false;
  local_c0.is_Dipole = false;
  local_c0.is_Quadrupole = false;
  local_c0.is_Fluctuating = false;
  local_c0.uses_SlaterIntramolecular = false;
  local_110.at_ = atomType;
  bVar7 = FixedChargeAdapter::isFixedCharge(&local_110);
  if (bVar7) {
    local_c0.is_Charge = true;
    local_c0.fixedCharge = FixedChargeAdapter::getCharge(&local_110);
  }
  local_188.at_ = atomType;
  bVar7 = MultipoleAdapter::isMultipole(&local_188);
  if (bVar7) {
    bVar7 = MultipoleAdapter::isDipole(&local_188);
    if (bVar7) {
      local_c0.is_Dipole = true;
      MultipoleAdapter::getDipole((Vector3d *)&local_108,&local_188);
      local_c0.dipole.super_Vector<double,_3U>.data_[2] =
           local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
      local_c0.dipole.super_Vector<double,_3U>.data_[0] =
           local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
      local_c0.dipole.super_Vector<double,_3U>.data_[1] =
           local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    }
    bVar7 = MultipoleAdapter::isQuadrupole(&local_188);
    if (bVar7) {
      local_c0.is_Quadrupole = true;
      MultipoleAdapter::getQuadrupole(&local_108,&local_188);
      lVar8 = 0;
      do {
        *(undefined8 *)
         ((long)local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                data_[0] + lVar8 + 0x10) =
             *(undefined8 *)
              ((long)local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0] + lVar8 + 0x10);
        uVar5 = *(undefined8 *)
                 ((long)local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar8 + 8);
        *(undefined8 *)
         ((long)local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                data_[0] + lVar8) =
             *(undefined8 *)
              ((long)local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0] + lVar8);
        *(undefined8 *)
         ((long)local_c0.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                data_[0] + lVar8 + 8) = uVar5;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x48);
    }
  }
  local_118.at_ = atomType;
  bVar7 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_118);
  if (bVar7) {
    local_c0.is_Fluctuating = true;
    local_c0.uses_SlaterIntramolecular =
         FluctuatingChargeAdapter::usesSlaterIntramolecular(&local_118);
    local_c0.electronegativity = FluctuatingChargeAdapter::getElectronegativity(&local_118);
    local_c0.hardness = FluctuatingChargeAdapter::getHardness(&local_118);
    local_c0.slaterN = FluctuatingChargeAdapter::getSlaterN(&local_118);
    local_c0.slaterZeta = FluctuatingChargeAdapter::getSlaterZeta(&local_118);
  }
  local_18c = AtomType::getIdent(atomType);
  sVar6 = (this->Etypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar2 = (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar11 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->Etypes,(int *)&local_18c);
  if (pVar11.second == false) {
    snprintf(painCave.errMsg,2000,"Electrostatic already had a previous entry with ident %d\n",
             (ulong)local_18c);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_18c] = (int)sVar6;
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
  push_back(&this->ElectrostaticMap,&local_c0);
  if (local_c0.is_Fluctuating == true) {
    pVar11 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
             _M_insert_unique<int_const&>
                       ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        &this->FQtypes,(int *)&local_18c);
    if (pVar11.second == false) {
      snprintf(painCave.errMsg,2000,
               "Electrostatic already had a previous fluctuating charge entry with ident %d\n",
               (ulong)local_18c);
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
    }
    iVar10 = (int)sVar2;
    (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)local_18c] = iVar10;
    local_150 = (long)iVar10;
    local_138 = local_150 * 3;
    std::
    vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
    ::resize((this->Jij).
             super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_150,(long)this->nFlucq_);
    p_Var9 = (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_140 = &(this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var9 != local_140) {
      local_150 = local_150 << 4;
      do {
        m = local_c0.slaterN;
        iVar10 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)p_Var9[1]._M_color];
        lVar8 = (long)(this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)p_Var9[1]._M_color];
        pEVar3 = (this->ElectrostaticMap).
                 super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar7 = pEVar3[iVar10].uses_SlaterIntramolecular;
        n = pEVar3[iVar10].slaterN;
        local_128 = pEVar3[iVar10].slaterZeta;
        local_130 = local_c0.slaterZeta;
        local_180 = (CubicSpline *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
                  (&local_178,&local_180,(allocator<OpenMD::CubicSpline> *)&local_108);
        if ((local_c0.uses_SlaterIntramolecular == true) && ((bVar7 & 1U) != 0)) {
          local_170 = this->cutoffRadius_ + 2.0;
          local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0
          ;
          local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0
          ;
          local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0
          ;
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (double *)0x0;
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (double *)0x0;
          if (0 < this->np_) {
            local_170 = local_170 / (double)(this->np_ + -1);
            iVar10 = 0;
            do {
              iVar10 = iVar10 + 1;
              local_148 = (double)iVar10 * local_170;
              if (local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [1] == local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][2]) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&local_108,
                           (iterator)
                           local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][1],&local_148);
              }
              else {
                *(double *)
                 local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [1] = local_148;
                local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
                     = (double)((long)local_108.super_SquareMatrix<double,_3>.
                                      super_RectMatrix<double,_3U,_3U>.data_[0][1] + 8);
              }
              RVar4 = sSTOCoulInt(local_130,local_128,m,n,local_148 * 1.88972612);
              local_120 = RVar4 * 627.509469;
              if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&local_168,
                           (iterator)
                           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_120);
              }
              else {
                *local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_120;
                local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            } while (iVar10 < this->np_);
          }
          CubicSpline::addPoints
                    (local_180,(vector<double,_std::allocator<double>_> *)&local_108,&local_168);
          if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((void *)local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][0] != (void *)0x0) {
            operator_delete((void *)local_108.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][0],
                            (long)local_108.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][2] -
                            (long)local_108.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0]);
          }
        }
        puVar1 = (undefined8 *)
                 (*(long *)((long)&(((this->Jij).
                                     super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                                   )._M_impl.super__Vector_impl_data + local_138 * 8) + lVar8 * 0x10
                 );
        *puVar1 = local_180;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),&local_178);
        std::
        vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
        ::resize((this->Jij).
                 super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar8,(long)this->nFlucq_);
        puVar1 = (undefined8 *)
                 (*(long *)&(this->Jij).
                            super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar8].
                            super__Vector_base<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                            ._M_impl.super__Vector_impl_data + local_150);
        *puVar1 = local_180;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),&local_178);
        if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_140);
    }
  }
  return;
}

Assistant:

void Electrostatic::addType(AtomType* atomType) {
    ElectrostaticAtomData electrostaticAtomData;
    electrostaticAtomData.is_Charge                 = false;
    electrostaticAtomData.is_Dipole                 = false;
    electrostaticAtomData.is_Quadrupole             = false;
    electrostaticAtomData.is_Fluctuating            = false;
    electrostaticAtomData.uses_SlaterIntramolecular = false;

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);

    if (fca.isFixedCharge()) {
      electrostaticAtomData.is_Charge   = true;
      electrostaticAtomData.fixedCharge = fca.getCharge();
    }

    MultipoleAdapter ma = MultipoleAdapter(atomType);
    if (ma.isMultipole()) {
      if (ma.isDipole()) {
        electrostaticAtomData.is_Dipole = true;
        electrostaticAtomData.dipole    = ma.getDipole();
      }
      if (ma.isQuadrupole()) {
        electrostaticAtomData.is_Quadrupole = true;
        electrostaticAtomData.quadrupole    = ma.getQuadrupole();
      }
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);

    if (fqa.isFluctuatingCharge()) {
      electrostaticAtomData.is_Fluctuating = true;
      electrostaticAtomData.uses_SlaterIntramolecular =
          fqa.usesSlaterIntramolecular();
      electrostaticAtomData.electronegativity = fqa.getElectronegativity();
      electrostaticAtomData.hardness          = fqa.getHardness();
      electrostaticAtomData.slaterN           = fqa.getSlaterN();
      electrostaticAtomData.slaterZeta        = fqa.getSlaterZeta();
    }

    int atid  = atomType->getIdent();
    int etid  = Etypes.size();
    int fqtid = FQtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = Etypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Electrostatic already had a previous entry with ident %d\n",
               atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    Etids[atid] = etid;
    ElectrostaticMap.push_back(electrostaticAtomData);

    if (electrostaticAtomData.is_Fluctuating) {
      ret = FQtypes.insert(atid);
      if (ret.second == false) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "Electrostatic already had a previous fluctuating charge entry "
            "with ident %d\n",
            atid);
        painCave.severity = OPENMD_INFO;
        painCave.isFatal  = 0;
        simError();
      }
      FQtids[atid] = fqtid;
      Jij[fqtid].resize(nFlucq_);

      // Now, iterate over all known fluctuating and add to the
      // coulomb integral map:

      std::set<int>::iterator it;
      for (it = FQtypes.begin(); it != FQtypes.end(); ++it) {
        int etid2                     = Etids[(*it)];
        int fqtid2                    = FQtids[(*it)];
        ElectrostaticAtomData eaData2 = ElectrostaticMap[etid2];
        RealType a                    = electrostaticAtomData.slaterZeta;
        RealType b                    = eaData2.slaterZeta;
        int m                         = electrostaticAtomData.slaterN;
        int n                         = eaData2.slaterN;
        CubicSplinePtr J {std::make_shared<CubicSpline>()};

        // do both types actually use Slater orbitals?

        if ((electrostaticAtomData.uses_SlaterIntramolecular &&
             eaData2.uses_SlaterIntramolecular)) {
          // Create the spline of the coulombic integral for s-type
          // Slater orbitals.  Add a 2 angstrom safety window to deal
          // with cutoffGroups that have charged atoms longer than the
          // cutoffRadius away from each other.

          RealType rval;
          RealType dr = (cutoffRadius_ + 2.0) / RealType(np_ - 1);
          vector<RealType> rvals;
          vector<RealType> Jvals;
          // RealType j0, j0c, j1c;
          // don't start at i = 0, as rval = 0 is undefined for the
          // slater overlap integrals.
          for (int i = 1; i < np_ + 1; i++) {
            rval = RealType(i) * dr;
            rvals.push_back(rval);

            Jvals.push_back(
                sSTOCoulInt(a, b, m, n, rval * Constants::angstromToBohr) *
                Constants::hartreeToKcal);
          }

          J->addPoints(rvals, Jvals);
        }
        Jij[fqtid][fqtid2] = J;
        Jij[fqtid2].resize(nFlucq_);
        Jij[fqtid2][fqtid] = J;
      }
    }
    return;
  }